

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-as.c
# Opt level: O3

matches * atomdiscard_a(iasctx *ctx,void *v,int spos)

{
  matches *pmVar1;
  match *pmVar2;
  
  if (((ctx->atomsnum == spos) || (ctx->atoms[spos]->type != LITEM_EXPR)) ||
     (ctx->atoms[spos]->expr->type != EASM_EXPR_DISCARD)) {
    pmVar1 = (matches *)0x0;
  }
  else {
    pmVar1 = (matches *)calloc(0x10,1);
    pmVar1->mmax = 0x10;
    pmVar2 = (match *)malloc(0xb80);
    pmVar1->m = pmVar2;
    pmVar1->mnum = 1;
    *(undefined8 *)pmVar2 = 0;
    pmVar2->a[0] = 0;
    pmVar2->a[1] = 0;
    pmVar2->m[0] = 0;
    pmVar2->m[1] = 0;
    pmVar2->lpos = spos + 1;
    memset(&pmVar2->field_0x2c,0,0x8c);
  }
  return pmVar1;
}

Assistant:

struct matches *atomdiscard_a APROTO {
	if (spos == ctx->atomsnum || ctx->atoms[spos]->type != LITEM_EXPR)
		return 0;
	struct easm_expr *e = ctx->atoms[spos]->expr;
	if (e->type == EASM_EXPR_DISCARD) {
		return alwaysmatches(spos+1);
	} else {
		return 0;
	}
}